

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool __thiscall
testing::internal::TypedTestSuitePState::AddTestName
          (TypedTestSuitePState *this,char *file,int line,char *case_name,char *test_name)

{
  FILE *__stream;
  allocator local_a9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  int local_88;
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  __stream = _stderr;
  if (this->registered_ != true) {
    std::__cxx11::string::string((string *)&local_50,file,&local_a9);
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_50,local_48 + (long)local_50);
    if (local_a8 == &local_98) {
      local_68._8_8_ = local_98._8_8_;
      local_80._8_8_ = &local_68;
    }
    else {
      local_80._8_8_ = local_a8;
    }
    local_68._M_allocated_capacity._1_7_ = local_98._M_allocated_capacity._1_7_;
    local_68._M_local_buf[0] = local_98._M_local_buf[0];
    local_80._16_8_ = local_a0;
    local_a0 = 0;
    local_98._M_local_buf[0] = '\0';
    local_a8 = &local_98;
    local_88 = line;
    local_80._0_8_ = test_name;
    local_58 = line;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
    ::_M_emplace_unique<std::pair<char_const*,testing::internal::CodeLocation>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>,std::_Select1st<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testing::internal::CodeLocation>>>
                *)&this->registered_tests_,
               (pair<const_char_*,_testing::internal::CodeLocation> *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._8_8_ != &local_68) {
      operator_delete((void *)local_80._8_8_,local_68._0_8_ + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT71(local_98._M_allocated_capacity._1_7_,
                                        local_98._M_local_buf[0]) + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    return true;
  }
  FormatFileLocation_abi_cxx11_
            ((string *)local_80,(internal *)file,(char *)(ulong)(uint)line,(int)case_name);
  fprintf(__stream,"%s Test %s must be defined before REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
          local_80._0_8_,test_name,case_name);
  std::__cxx11::string::~string((string *)local_80);
  fflush(_stderr);
  posix::Abort();
}

Assistant:

bool AddTestName(const char* file, int line, const char* case_name,
                   const char* test_name) {
    if (registered_) {
      fprintf(stderr,
              "%s Test %s must be defined before "
              "REGISTER_TYPED_TEST_SUITE_P(%s, ...).\n",
              FormatFileLocation(file, line).c_str(), test_name, case_name);
      fflush(stderr);
      posix::Abort();
    }
    registered_tests_.insert(
        ::std::make_pair(test_name, CodeLocation(file, line)));
    return true;
  }